

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O2

Reals __thiscall Omega_h::refine_qualities_tmpl<3,1>(Omega_h *this,Mesh *mesh,LOs *candidates)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  Int ent_dim;
  LO size_in;
  size_t sVar2;
  Reals RVar3;
  Reals cand_quals;
  Write<double> quals_w;
  Write<int> local_1c0;
  Write<double> local_1b0;
  Write<double> local_1a0;
  Write<int> local_190;
  Reals coords;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  LOs cv2v;
  LOs ev2v;
  type f;
  MetricRefineQualities<3,_3> measure;
  Adj e2c;
  
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&ev2v,ent_dim);
  Mesh::ask_verts_of((Mesh *)&cv2v,ent_dim);
  Mesh::ask_up(&e2c,mesh,1,3);
  Write<int>::Write(&e2ec.write_,(Write<int> *)&e2c);
  Write<int>::Write(&ec2c.write_,&e2c.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&ec_codes.write_,&e2c.codes.write_);
  Mesh::coords((Mesh *)&coords);
  pAVar1 = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write(&local_190,&candidates->write_);
  MetricRefineQualities<3,_1>::MetricRefineQualities
            ((MetricRefineQualities<3,_1> *)&measure,mesh,(LOs *)&local_190);
  Write<int>::~Write(&local_190);
  std::__cxx11::string::string((string *)&f,"",(allocator *)&cand_quals);
  size_in = (LO)(sVar2 >> 2);
  Write<double>::Write(&quals_w,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&candidates->write_);
  Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
  Write<double>::Write(&f.coords.write_,&coords.write_);
  Write<int>::Write(&f.e2ec.write_,&e2ec.write_);
  Write<int>::Write(&f.ec2c.write_,&ec2c.write_);
  Write<signed_char>::Write(&f.ec_codes.write_,&ec_codes.write_);
  Write<int>::Write(&f.cv2v.write_,&cv2v.write_);
  MetricRefineQualities<3,_1>::MetricRefineQualities
            ((MetricRefineQualities<3,_1> *)&f.measure,&measure);
  Write<double>::Write(&f.quals_w,&quals_w);
  parallel_for<Omega_h::refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,&f,"refine_qualities");
  Write<double>::Write(&local_1a0,&quals_w);
  Read<double>::Read((Read<signed_char> *)&cand_quals,&local_1a0);
  Write<double>::~Write(&local_1a0);
  Write<double>::Write(&local_1b0,&cand_quals.write_);
  Write<int>::Write(&local_1c0,&candidates->write_);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,ent_dim,(Read<double> *)0x1,(LOs *)&local_1b0,-1.0,(Int)&local_1c0);
  Write<int>::~Write(&local_1c0);
  Write<double>::~Write(&local_1b0);
  Write<double>::~Write(&cand_quals.write_);
  refine_qualities_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&f);
  Write<double>::~Write(&quals_w);
  MetricRefineQualities<3,_1>::~MetricRefineQualities((MetricRefineQualities<3,_1> *)&measure);
  Write<double>::~Write(&coords.write_);
  Write<signed_char>::~Write(&ec_codes.write_);
  Write<int>::~Write(&ec2c.write_);
  Write<int>::~Write(&e2ec.write_);
  Adj::~Adj(&e2c);
  Write<int>::~Write(&cv2v.write_);
  Write<int>::~Write(&ev2v.write_);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals refine_qualities_tmpl(Mesh* mesh, LOs candidates) {
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_verts_of(mesh_dim);
  auto e2c = mesh->ask_up(EDGE, mesh_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto coords = mesh->coords();
  auto ncands = candidates.size();
  auto measure = MetricRefineQualities<mesh_dim, metric_dim>(mesh, candidates);
  Write<Real> quals_w(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = candidates[cand];
    auto eev2v = gather_verts<2>(ev2v, e);
    auto ep = gather_vectors<2, mesh_dim>(coords, eev2v);
    auto midp = (ep[0] + ep[1]) / 2.;
    auto minqual = 1.0;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto code = ec_codes[ec];
      auto cce = code_which_down(code);
      auto rot = code_rotation(code);
      auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
      for (Int eev = 0; eev < 2; ++eev) {
        /* a new cell is formed from an old cell by finding
           its side that is opposite to one of the edge endpoints
           and connecting it to the midpoint to form the new cell
           (see refine_domain_interiors) */
        auto cev = eev ^ rot;
        auto ccv = simplex_down_template(mesh_dim, EDGE, cce, cev);
        auto ccs = simplex_opposite_template(mesh_dim, VERT, ccv);
        Few<LO, mesh_dim> csv2v;
        Few<Vector<mesh_dim>, mesh_dim + 1> ncp;
        for (Int csv = 0; csv < mesh_dim; ++csv) {
          auto ccv2 = simplex_down_template(mesh_dim, mesh_dim - 1, ccs, csv);
          auto v2 = ccv2v[ccv2];
          csv2v[csv] = v2;
          ncp[csv] = get_vector<mesh_dim>(coords, v2);
        }
        ncp[mesh_dim] = midp;
        flip_new_elem<mesh_dim>(&csv2v[0]);
        flip_new_elem<mesh_dim>(&ncp[0]);
        auto cqual = measure.measure(cand, ncp, csv2v);
        minqual = min2(minqual, cqual);
      }
    }
    quals_w[cand] = minqual;
  };
  parallel_for(ncands, f, "refine_qualities");
  auto cand_quals = Reals(quals_w);
  return mesh->sync_subset_array(EDGE, cand_quals, candidates, -1.0, 1);
}